

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O2

void __thiscall C2dPtSel::initialize(C2dPtSel *this,CCfg *oCfg,Mat *oImgFrm)

{
  Mat local_80 [96];
  
  CCfg::operator=(&this->m_oCfg,oCfg);
  cv::Mat::clone();
  cv::Mat::operator=(&this->m_oImgFrm,local_80);
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void C2dPtSel::initialize(CCfg oCfg, cv::Mat oImgFrm)
{
	// configuration parameters
	m_oCfg = oCfg;

	// frame image for plotting results
	m_oImgFrm = oImgFrm.clone();
}